

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.cpp
# Opt level: O0

Polynom<Rational> __thiscall
Polynom<Rational>::ordinalSub(Polynom<Rational> *this,Polynom<Rational> *a)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  Rational *extraout_RDX;
  Rational *extraout_RDX_00;
  Rational *pRVar5;
  undefined8 in_RDI;
  Polynom<Rational> PVar6;
  compare_t cmp_1;
  Polynom<Rational> res_1;
  BigInteger mid;
  compare_t cmp;
  Polynom<Rational> res;
  BigInteger r;
  BigInteger l;
  int coeff;
  Matrix<Rational> m;
  int d;
  Polynom<Rational> *t;
  Rational *in_stack_fffffffffffffcc8;
  row_t in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd8;
  compare_t in_stack_fffffffffffffcdc;
  BigInteger *in_stack_fffffffffffffce0;
  Rational *in_stack_fffffffffffffce8;
  row_t in_stack_fffffffffffffcf0;
  BigInteger *a_00;
  undefined7 in_stack_fffffffffffffd08;
  byte in_stack_fffffffffffffd0f;
  int in_stack_fffffffffffffd10;
  compare_t in_stack_fffffffffffffd14;
  undefined8 in_stack_fffffffffffffd18;
  Polynom<Rational> *this_00;
  Matrix<Rational> *in_stack_fffffffffffffd20;
  MatrixRow<Rational_&> local_298 [9];
  compare_t local_24c;
  Polynom<Rational> *in_stack_fffffffffffffdb8;
  MatrixRow<Rational_&> local_230;
  BigInteger local_228;
  Polynom<Rational> *in_stack_fffffffffffffe00;
  Polynom<Rational> *in_stack_fffffffffffffe08;
  BigInteger local_1c8 [5];
  int local_128;
  compare_t local_124;
  byte local_109;
  MatrixRow<Rational_&> local_108 [9];
  Polynom<Rational> local_c0 [8];
  uint local_3c;
  int local_28;
  
  bVar1 = isOrdinal(in_stack_fffffffffffffdb8);
  if ((!bVar1) || (bVar1 = isOrdinal(in_stack_fffffffffffffdb8), !bVar1)) {
    uVar4 = __cxa_allocate_exception(0x10);
    matrix_error::runtime_error
              ((matrix_error *)in_stack_fffffffffffffcd0.arr,(char *)in_stack_fffffffffffffcc8);
    __cxa_throw(uVar4,&matrix_error::typeinfo,matrix_error::~matrix_error);
  }
  iVar2 = degree((Polynom<Rational> *)in_stack_fffffffffffffce8);
  local_28 = iVar2;
  if ((iVar2 < 0) || (iVar3 = degree((Polynom<Rational> *)in_stack_fffffffffffffce8), iVar2 < iVar3)
     ) {
    Polynom((Polynom<Rational> *)0x177bd2);
    pRVar5 = extraout_RDX;
  }
  else {
    Matrix<Rational>::Matrix
              (in_stack_fffffffffffffd20,(uint)((ulong)in_stack_fffffffffffffd18 >> 0x20),
               (uint)in_stack_fffffffffffffd18);
    for (local_3c = 0; (int)local_3c < local_28 + 1; local_3c = local_3c + 1) {
      BigInteger::BigInteger
                (in_stack_fffffffffffffce0,
                 CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      BigInteger::BigInteger
                (in_stack_fffffffffffffce0,
                 CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      while( true ) {
        BigInteger::BigInteger
                  (in_stack_fffffffffffffce0,
                   CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
        ::operator-(&in_stack_fffffffffffffce8->_numerator,in_stack_fffffffffffffce0);
        Rational::Rational(in_stack_fffffffffffffcd0.arr,&in_stack_fffffffffffffcc8->_numerator);
        local_108[0].arr = (Rational *)Matrix<Rational>::operator[](in_stack_fffffffffffffcc8,0);
        Matrix<Rational>::MatrixRow<Rational_&>::operator[](local_108,local_3c);
        this_00 = local_c0;
        Rational::operator=(in_stack_fffffffffffffcd0.arr,in_stack_fffffffffffffcc8);
        Rational::~Rational(in_stack_fffffffffffffcd0.arr);
        BigInteger::~BigInteger((BigInteger *)0x177cf0);
        BigInteger::~BigInteger((BigInteger *)0x177cfd);
        local_109 = 0;
        Polynom((Polynom<Rational> *)in_stack_fffffffffffffcf0.arr,
                (Matrix<Rational> *)in_stack_fffffffffffffce8);
        ordinalAdd(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
        in_stack_fffffffffffffd14 =
             ordinalCmp(this_00,(Polynom<Rational> *)
                                CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
        if (in_stack_fffffffffffffd14 == CMP_EQUAL) {
          local_109 = 1;
          local_128 = 1;
        }
        else if (in_stack_fffffffffffffd14 == CMP_LESS) {
          local_128 = 5;
        }
        else {
          local_128 = 0;
        }
        local_124 = in_stack_fffffffffffffd14;
        ~Polynom((Polynom<Rational> *)0x177e64);
        if ((local_109 & 1) == 0) {
          ~Polynom((Polynom<Rational> *)0x177e7b);
        }
        in_stack_fffffffffffffd10 = local_128;
        if (local_128 != 0) break;
        BigInteger::BigInteger
                  (in_stack_fffffffffffffce0,
                   CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
        BigInteger::operator*=
                  ((BigInteger *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                   (BigInteger *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08));
        BigInteger::~BigInteger((BigInteger *)0x177ed0);
      }
      if (local_128 == 5) {
        do {
          BigInteger::BigInteger
                    (in_stack_fffffffffffffce0,
                     CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
          ::operator+(&in_stack_fffffffffffffce8->_numerator,in_stack_fffffffffffffce0);
          in_stack_fffffffffffffd0f =
               operator<(&(in_stack_fffffffffffffcd0.arr)->_numerator,
                         &in_stack_fffffffffffffcc8->_numerator);
          BigInteger::~BigInteger((BigInteger *)0x177f3e);
          BigInteger::~BigInteger((BigInteger *)0x177f4b);
          if ((in_stack_fffffffffffffd0f & 1) == 0) {
            Rational::Rational(in_stack_fffffffffffffcd0.arr,&in_stack_fffffffffffffcc8->_numerator)
            ;
            in_stack_fffffffffffffcd0 = Matrix<Rational>::operator[](in_stack_fffffffffffffcc8,0);
            local_298[0].arr = in_stack_fffffffffffffcd0.arr;
            in_stack_fffffffffffffcc8 =
                 Matrix<Rational>::MatrixRow<Rational_&>::operator[](local_298,local_3c);
            Rational::operator=(in_stack_fffffffffffffcd0.arr,in_stack_fffffffffffffcc8);
            Rational::~Rational(in_stack_fffffffffffffcd0.arr);
            local_128 = 0;
            break;
          }
          a_00 = local_1c8;
          ::operator+(&in_stack_fffffffffffffce8->_numerator,in_stack_fffffffffffffce0);
          BigInteger::BigInteger
                    (in_stack_fffffffffffffce0,
                     CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
          ::operator/(a_00,&(in_stack_fffffffffffffcf0.arr)->_numerator);
          BigInteger::~BigInteger((BigInteger *)0x177fb7);
          BigInteger::~BigInteger((BigInteger *)0x177fc4);
          Rational::Rational(in_stack_fffffffffffffcd0.arr,&in_stack_fffffffffffffcc8->_numerator);
          in_stack_fffffffffffffcf0 = Matrix<Rational>::operator[](in_stack_fffffffffffffcc8,0);
          local_230.arr = in_stack_fffffffffffffcf0.arr;
          in_stack_fffffffffffffce8 =
               Matrix<Rational>::MatrixRow<Rational_&>::operator[](&local_230,local_3c);
          in_stack_fffffffffffffce0 = &local_228;
          Rational::operator=(in_stack_fffffffffffffcd0.arr,in_stack_fffffffffffffcc8);
          Rational::~Rational(in_stack_fffffffffffffcd0.arr);
          bVar1 = false;
          Polynom((Polynom<Rational> *)in_stack_fffffffffffffcf0.arr,
                  (Matrix<Rational> *)in_stack_fffffffffffffce8);
          ordinalAdd(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
          in_stack_fffffffffffffcdc =
               ordinalCmp(this_00,(Polynom<Rational> *)
                                  CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
          local_24c = in_stack_fffffffffffffcdc;
          if (in_stack_fffffffffffffcdc == CMP_EQUAL) {
            bVar1 = true;
            local_128 = 1;
          }
          else {
            if (in_stack_fffffffffffffcdc == CMP_LESS) {
              BigInteger::operator=
                        (&(in_stack_fffffffffffffcd0.arr)->_numerator,
                         &in_stack_fffffffffffffcc8->_numerator);
            }
            else {
              BigInteger::operator=
                        (&(in_stack_fffffffffffffcd0.arr)->_numerator,
                         &in_stack_fffffffffffffcc8->_numerator);
            }
            local_128 = 0;
          }
          ~Polynom((Polynom<Rational> *)0x1781c9);
          if (!bVar1) {
            ~Polynom((Polynom<Rational> *)0x1781e0);
          }
          BigInteger::~BigInteger((BigInteger *)0x1781ed);
        } while (local_128 == 0);
      }
      BigInteger::~BigInteger((BigInteger *)0x1782ac);
      BigInteger::~BigInteger((BigInteger *)0x1782b9);
      if (local_128 != 0) goto LAB_00178359;
    }
    Polynom((Polynom<Rational> *)in_stack_fffffffffffffcf0.arr,
            (Matrix<Rational> *)in_stack_fffffffffffffce8);
    local_128 = 1;
LAB_00178359:
    Matrix<Rational>::~Matrix((Matrix<Rational> *)in_stack_fffffffffffffce0);
    pRVar5 = extraout_RDX_00;
  }
  PVar6.m.arr = pRVar5;
  PVar6.m._0_8_ = in_RDI;
  return (Polynom<Rational>)PVar6.m;
}

Assistant:

const Polynom<Field> Polynom<Field>::ordinalSub(const Polynom &a) const
{
    if(!isOrdinal() || !a.isOrdinal())
        throw matrix_error("Invalid ordinal");
    int d = degree();
    if(d < 0 || d < a.degree())
        return Polynom();
    Matrix<Field> m(1, d + 1);
    for(int coeff = 0; coeff < d + 1; ++coeff)
    {
        BigInteger l = 0, r = 1;
        for(;; r *= 2)
        {
            m[0][coeff] = r - 1;
            Polynom t(m);
            Polynom res = a.ordinalAdd(t);
            compare_t cmp = ordinalCmp(res);
            if(cmp == CMP_EQUAL)
                return t;
            if(cmp == CMP_LESS)
                break;
        }
        while(l + 1 < r)
        {
            BigInteger mid = (l + r) / 2;
            m[0][coeff] = mid;
            Polynom t(m);
            Polynom res = a.ordinalAdd(t);
            compare_t cmp = ordinalCmp(res);
            if(cmp == CMP_EQUAL)
                return t;
            if(cmp == CMP_LESS)
                r = mid;
            else
                l = mid;
        }
        m[0][coeff] = l;
    }
    return Polynom(m);
}